

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::String,kj::StringPtr&,kj::StringPtr>
          (String *__return_storage_ptr__,_ *this,String *params,StringPtr *params_1,
          StringPtr *params_2)

{
  long lVar1;
  size_t size;
  char *target;
  size_t local_38 [3];
  
  size = 0;
  local_38[0] = *(long *)(this + 8) - 1;
  if (*(long *)(this + 8) == 0) {
    local_38[0] = size;
  }
  local_38[1] = (params->content).size_ - 1;
  local_38[2] = (params_1->content).size_ - 1;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_38 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::String,kj::StringPtr&,kj::StringPtr>(target,(String *)this,(StringPtr *)params,params_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}